

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RU_matrix.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_false,_true>_>_>
::_insert_boundary(RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_false,_true>_>_>
                   *this,Index currentIndex)

{
  uint uVar1;
  pointer pIVar2;
  undefined1 *puVar3;
  Column_support *pCVar4;
  Index local_24;
  initializer_list<unsigned_int> local_20;
  
  local_20._M_array = &local_24;
  local_20._M_len = 1;
  local_24 = currentIndex;
  Base_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true,false,true>>>
  ::insert_column<std::initializer_list<unsigned_int>>
            ((Base_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true,false,true>>>
              *)&this->mirrorMatrixU_,&local_20);
  pIVar2 = (this->reducedMatrixR_).matrix_.
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_false,_true>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pCVar4 = &pIVar2[currentIndex].column_;
  puVar3 = *(undefined1 **)&(pCVar4->super_type).data_.root_plus_size_;
  if ((Column_support *)puVar3 != pCVar4 && puVar3 != (undefined1 *)0x0) {
    uVar1 = *(uint *)&(*(node_ptr *)((long)&pIVar2[currentIndex].column_.super_type.data_ + 8))[1].
                      next_;
    if (((ulong)uVar1 != 0xffffffff) &&
       ((ulong)((long)(this->pivotToColumnIndex_).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->pivotToColumnIndex_).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2) <= (ulong)uVar1)) {
      local_20._M_array = (iterator)CONCAT44(local_20._M_array._4_4_,0xffffffff);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                (&this->pivotToColumnIndex_,(ulong)(uVar1 * 2 + 2),(value_type_conflict1 *)&local_20
                );
    }
  }
  _reduce_last_column(this,currentIndex);
  this->nextEventIndex_ = this->nextEventIndex_ + 1;
  return;
}

Assistant:

inline void RU_matrix<Master_matrix>::_insert_boundary(Index currentIndex)
{
  if constexpr (Master_matrix::Option_list::is_z2) {
    mirrorMatrixU_.insert_column({currentIndex});
  } else {
    mirrorMatrixU_.insert_column({{currentIndex, 1}});
  }

  if constexpr (!Master_matrix::Option_list::has_map_column_container) {
    ID_index pivot = reducedMatrixR_.get_column(currentIndex).get_pivot();
    if (pivot != Master_matrix::template get_null_value<ID_index>() && pivotToColumnIndex_.size() <= pivot)
      pivotToColumnIndex_.resize((pivot + 1) * 2, Master_matrix::template get_null_value<Index>());
  }

  _reduce_last_column(currentIndex);
  ++nextEventIndex_;
}